

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3WalCheckpoint
              (Wal *pWal,sqlite3 *db,int eMode,_func_int_void_ptr *xBusy,void *pBusyArg,
              int sync_flags,int nBuf,u8 *zBuf,int *pnLog,int *pnCkpt)

{
  uint *puVar1;
  u16 uVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  sqlite3_io_methods *psVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  ht_slot *aTmp;
  ulong uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  int *piVar16;
  uint *puVar17;
  u32 *aContent;
  sqlite3_uint64 n;
  uint uVar18;
  long lVar19;
  uint uVar20;
  uint *local_1c8;
  int nMerge;
  uint local_1a4;
  int local_1a0;
  u32 iZero;
  u32 *local_198;
  ulong local_190;
  ht_slot *aMerge;
  void *local_180;
  uint *local_178;
  ulong local_170;
  int isChanged;
  ulong local_160;
  int nList;
  undefined4 uStack_154;
  ulong local_150;
  _func_int_void_ptr *local_148;
  ulong local_140;
  uint local_134;
  sqlite3 *local_130;
  u32 *local_128;
  ulong local_120;
  ulong local_118;
  ht_slot *aHash;
  i64 nSize;
  int local_100 [52];
  
  isChanged = 0;
  if (pWal->readOnly != '\0') {
    return 8;
  }
  local_130 = db;
  iVar9 = walLockExclusive(pWal,1,1);
  if (iVar9 != 0) {
    return iVar9;
  }
  pWal->ckptLock = '\x01';
  uVar15 = 0;
  if (eMode == 0) {
LAB_00123087:
    iVar9 = walIndexReadHdr(pWal,&isChanged);
    if (isChanged != 0) {
      psVar7 = pWal->pDbFd->pMethods;
      if (2 < psVar7->iVersion) {
        (*psVar7->xUnfetch)(pWal->pDbFd,0,(void *)0x0);
      }
    }
  }
  else {
    iVar9 = walBusyLock(pWal,xBusy,pBusyArg,0,1);
    if (iVar9 == 5) {
      xBusy = (_func_int_void_ptr *)0x0;
      goto LAB_00123087;
    }
    if (iVar9 == 0) {
      pWal->writeLock = '\x01';
      uVar15 = (ulong)(uint)eMode;
      goto LAB_00123087;
    }
    uVar15 = (ulong)(uint)eMode;
  }
  if (iVar9 != 0) goto LAB_0012348f;
  uVar10 = (pWal->hdr).mxFrame;
  uVar2 = (pWal->hdr).szPage;
  uVar12 = CONCAT22(uVar2,uVar2) & 0x1fe00;
  if ((uVar10 == 0) || (uVar12 == nBuf)) {
    local_198 = *pWal->apWiData;
    local_160 = (ulong)uVar10;
    if (local_198[0x18] < uVar10) {
      uVar14 = (ulong)(uVar10 + 0x1000) + 0xffffffff021 >> 0xc;
      iVar9 = (int)uVar14;
      n = (sqlite3_uint64)(int)(iVar9 * 0x20 + uVar10 * 2 + 0x28);
      local_1a4 = uVar12;
      local_148 = xBusy;
      local_1c8 = (uint *)sqlite3_malloc64(n);
      if (local_1c8 == (uint *)0x0) {
        iVar9 = 7;
        goto LAB_0012348f;
      }
      local_1a0 = eMode;
      local_180 = pBusyArg;
      local_150 = uVar15;
      memset(local_1c8,0,n);
      local_1c8[1] = iVar9 + 1;
      uVar15 = 0;
      uVar10 = 0x1000;
      if ((uint)local_160 < 0x1000) {
        uVar10 = (uint)local_160;
      }
      aTmp = (ht_slot *)sqlite3_malloc64((ulong)(uVar10 * 2));
      uVar11 = 7;
      if (aTmp != (ht_slot *)0x0) {
        uVar11 = uVar15;
      }
      puVar17 = local_1c8 + 2;
      local_170 = (ulong)iVar9;
      local_120 = uVar14 & 0xffffffff;
      local_178 = puVar17;
      for (; (iVar9 = (int)uVar11, iVar9 == 0 && ((long)uVar15 <= (long)local_170));
          uVar15 = uVar15 + 1) {
        uVar10 = walHashGet(pWal,(int)uVar15,&aHash,&local_128,&iZero);
        if (uVar10 == 0) {
          aContent = local_128 + 1;
          local_140 = local_140 & 0xffffffff00000000;
          if (uVar15 == local_120) {
            _nList = (ulong)((int)local_160 - iZero);
          }
          else {
            _nList = (ulong)((long)aHash - (long)aContent) >> 2;
          }
          local_190 = (long)puVar17 + (ulong)iZero * 2 + (long)(int)local_1c8[1] * 0x20;
          iZero = iZero + 1;
          uVar14 = 0;
          if (0 < (int)_nList) {
            uVar14 = _nList & 0xffffffff;
          }
          for (uVar11 = 0; uVar14 != uVar11; uVar11 = uVar11 + 1) {
            *(short *)(local_190 + uVar11 * 2) = (short)uVar11;
          }
          nMerge = 0;
          aMerge = (ht_slot *)0x0;
          local_134 = iZero;
          local_128 = aContent;
          local_118 = uVar15;
          memset(&nSize,0,0xd0);
          uVar10 = 0;
          for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
            nMerge = 1;
            aMerge = (ht_slot *)(local_190 + uVar15 * 2);
            for (uVar10 = 0; uVar11 = (ulong)uVar10, ((uint)uVar15 >> (uVar10 & 0x1f) & 1) != 0;
                uVar10 = uVar10 + 1) {
              walMerge(aContent,*(ht_slot **)(local_100 + uVar11 * 4),
                       local_100[(uVar11 * 2 + -1) * 2],&aMerge,&nMerge,aTmp);
            }
            *(ht_slot **)(local_100 + uVar11 * 4) = aMerge;
            local_100[(uVar11 * 2 + -1) * 2] = nMerge;
          }
          uVar14 = (ulong)(uVar10 + 1);
          piVar16 = local_100 + uVar14 * 4;
          uVar15 = _nList;
          while (uVar10 = (uint)uVar14, uVar10 < 0xd) {
            if (((uint)uVar15 >> (uVar10 & 0x1f) & 1) != 0) {
              walMerge(aContent,*(ht_slot **)piVar16,piVar16[-2],&aMerge,&nMerge,aTmp);
              uVar15 = _nList;
            }
            piVar16 = piVar16 + 4;
            uVar14 = (ulong)(uVar10 + 1);
          }
          local_178[local_118 * 8 + 7] = local_134;
          local_178[local_118 * 8 + 6] = nMerge;
          *(ulong *)(local_178 + local_118 * 8 + 2) = local_190;
          *(u32 **)(local_178 + local_118 * 8 + 4) = aContent;
          puVar17 = local_178;
          uVar15 = local_118;
          uVar10 = (uint)local_140;
        }
        uVar11 = (ulong)uVar10;
      }
      sqlite3_free(aTmp);
      if (iVar9 != 0) {
        sqlite3_free(local_1c8);
        uVar15 = local_150;
        eMode = local_1a0;
        goto LAB_00123456;
      }
      uVar10 = (pWal->hdr).mxFrame;
      local_190 = (ulong)(pWal->hdr).nPage;
      iVar9 = 0;
      xBusy = local_148;
      for (lVar19 = 0; pBusyArg = local_180, lVar19 != 4; lVar19 = lVar19 + 1) {
        uVar12 = local_198[lVar19 + 0x1a];
        if (uVar12 < uVar10) {
          iVar13 = (int)lVar19 + 4;
          iVar9 = walBusyLock(pWal,xBusy,local_180,iVar13,1);
          if (iVar9 == 5) {
            xBusy = (_func_int_void_ptr *)0x0;
            uVar10 = uVar12;
          }
          else {
            uVar15 = local_150;
            eMode = local_1a0;
            if (iVar9 != 0) goto LAB_0012344b;
            local_198[lVar19 + 0x1a] = -(uint)(lVar19 != 0) | uVar10;
            walUnlockExclusive(pWal,iVar13,1);
            iVar9 = 0;
          }
        }
      }
      if ((local_198[0x18] < uVar10) && (iVar9 = walBusyLock(pWal,xBusy,local_180,3,1), iVar9 == 0))
      {
        _nList = CONCAT44(uStack_154,local_198[0x18]);
        local_198[0x20] = uVar10;
        local_170 = (ulong)local_1a4;
        local_148 = xBusy;
        if ((sync_flags == 0) ||
           (iVar13 = (*pWal->pWalFd->pMethods->xSync)(pWal->pWalFd,sync_flags), iVar13 == 0)) {
          aMerge = (ht_slot *)(local_190 * local_170);
          iVar13 = (*pWal->pDbFd->pMethods->xFileSize)(pWal->pDbFd,&nSize);
          if ((iVar13 == 0) && (CONCAT44(nSize._4_4_,(u32)nSize) < (long)aMerge)) {
            (*pWal->pDbFd->pMethods->xFileControl)(pWal->pDbFd,5,&aMerge);
          }
        }
        local_140 = (ulong)(local_1a4 | 0x18);
        uVar12 = 0;
        puVar17 = local_178;
        do {
          do {
            iVar9 = iVar13;
            uVar8 = local_1a4;
            if (iVar9 != 0) goto LAB_001238db;
            uVar4 = *local_1c8;
            uVar15 = (ulong)local_1c8[1];
            uVar20 = 0xffffffff;
LAB_00123738:
            if (0 < (int)uVar15) {
              uVar15 = uVar15 - 1;
              puVar1 = puVar17 + uVar15 * 8;
              uVar5 = puVar17[uVar15 * 8 + 6];
              uVar18 = puVar17[uVar15 * 8];
              for (lVar19 = (long)(int)uVar18; uVar18 = uVar18 + 1, lVar19 < (int)uVar5;
                  lVar19 = lVar19 + 1) {
                uVar3 = *(ushort *)(*(long *)(puVar1 + 2) + lVar19 * 2);
                uVar6 = *(uint *)(*(long *)(puVar1 + 4) + (ulong)uVar3 * 4);
                if (uVar4 < uVar6) {
                  if (uVar6 < uVar20) {
                    uVar12 = (uint)uVar3 + puVar1[7];
                    uVar20 = uVar6;
                  }
                  break;
                }
                *puVar1 = uVar18;
              }
              goto LAB_00123738;
            }
            *local_1c8 = uVar20;
            if (uVar20 == 0xffffffff) {
              if (uVar10 == (*pWal->apWiData)[4]) {
                iVar9 = (*pWal->pDbFd->pMethods->xTruncate)
                                  (pWal->pDbFd,local_170 * (pWal->hdr).nPage);
                if ((sync_flags != 0) && (iVar9 == 0)) {
                  iVar9 = (*pWal->pDbFd->pMethods->xSync)(pWal->pDbFd,sync_flags);
                }
                pBusyArg = local_180;
                if (iVar9 != 0) goto LAB_001238db;
              }
              local_198[0x18] = uVar10;
              iVar9 = 0;
              goto LAB_001238db;
            }
            if ((local_130->u1).isInterrupted != 0) {
              iVar9 = (uint)(local_130->mallocFailed == '\0') * 2 + 7;
              goto LAB_001238db;
            }
            iVar13 = 0;
          } while (((uVar12 <= (uint)nList) || (uVar10 < uVar12)) || ((uint)local_190 < uVar20));
          iVar9 = (*pWal->pWalFd->pMethods->xRead)
                            (pWal->pWalFd,zBuf,local_1a4,(uVar12 - 1) * local_140 + 0x38);
          pBusyArg = local_180;
          if (iVar9 != 0) break;
          iVar9 = (*pWal->pDbFd->pMethods->xWrite)(pWal->pDbFd,zBuf,uVar8,(uVar20 - 1) * local_170);
          puVar17 = local_178;
          pBusyArg = local_180;
          iVar13 = 0;
        } while (iVar9 == 0);
LAB_001238db:
        walUnlockExclusive(pWal,3,1);
        xBusy = local_148;
      }
      uVar15 = local_150;
      eMode = local_1a0;
      if (iVar9 == 5) {
        iVar9 = 0;
      }
    }
    else {
      local_1c8 = (uint *)0x0;
      iVar9 = 0;
    }
    iVar13 = (int)uVar15;
    if (((iVar13 != 0) && (iVar9 == 0)) && (iVar9 = 5, (pWal->hdr).mxFrame <= local_198[0x18])) {
      if (iVar13 < 2) {
        iVar9 = 0;
      }
      else {
        sqlite3_randomness(4,&nSize);
        iVar9 = walBusyLock(pWal,xBusy,pBusyArg,4,4);
        if (iVar9 == 0) {
          iVar9 = 0;
          if (iVar13 == 3) {
            walRestartHdr(pWal,(u32)nSize);
            iVar9 = (*pWal->pWalFd->pMethods->xTruncate)(pWal->pWalFd,0);
          }
          walUnlockExclusive(pWal,4,4);
        }
      }
    }
LAB_0012344b:
    sqlite3_free(local_1c8);
  }
  else {
    iVar9 = sqlite3CorruptError(0xe13b);
  }
LAB_00123456:
  if ((iVar9 == 5) || (iVar9 == 0)) {
    if (pnLog != (int *)0x0) {
      *pnLog = (pWal->hdr).mxFrame;
    }
    if (pnCkpt != (int *)0x0) {
      *pnCkpt = (*pWal->apWiData)[0x18];
    }
  }
LAB_0012348f:
  if (isChanged != 0) {
    (pWal->hdr).aSalt[0] = 0;
    (pWal->hdr).aSalt[1] = 0;
    (pWal->hdr).aCksum[0] = 0;
    (pWal->hdr).aCksum[1] = 0;
    (pWal->hdr).mxFrame = 0;
    (pWal->hdr).nPage = 0;
    (pWal->hdr).aFrameCksum[0] = 0;
    (pWal->hdr).aFrameCksum[1] = 0;
    (pWal->hdr).iVersion = 0;
    (pWal->hdr).unused = 0;
    (pWal->hdr).iChange = 0;
    (pWal->hdr).isInit = '\0';
    (pWal->hdr).bigEndCksum = '\0';
    (pWal->hdr).szPage = 0;
  }
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal,1,1);
  iVar13 = 5;
  if (iVar9 != 0) {
    iVar13 = iVar9;
  }
  pWal->ckptLock = '\0';
  if ((int)uVar15 == eMode) {
    iVar13 = iVar9;
  }
  return iVar13;
}

Assistant:

SQLITE_PRIVATE int sqlite3WalCheckpoint(
  Wal *pWal,                      /* Wal connection */
  sqlite3 *db,                    /* Check this handle's interrupt flag */
  int eMode,                      /* PASSIVE, FULL, RESTART, or TRUNCATE */
  int (*xBusy)(void*),            /* Function to call when busy */
  void *pBusyArg,                 /* Context argument for xBusyHandler */
  int sync_flags,                 /* Flags to sync db file with (or 0) */
  int nBuf,                       /* Size of temporary buffer */
  u8 *zBuf,                       /* Temporary buffer to use */
  int *pnLog,                     /* OUT: Number of frames in WAL */
  int *pnCkpt                     /* OUT: Number of backfilled frames in WAL */
){
  int rc;                         /* Return code */
  int isChanged = 0;              /* True if a new wal-index header is loaded */
  int eMode2 = eMode;             /* Mode to pass to walCheckpoint() */
  int (*xBusy2)(void*) = xBusy;   /* Busy handler for eMode2 */

  assert( pWal->ckptLock==0 );
  assert( pWal->writeLock==0 );

  /* EVIDENCE-OF: R-62920-47450 The busy-handler callback is never invoked
  ** in the SQLITE_CHECKPOINT_PASSIVE mode. */
  assert( eMode!=SQLITE_CHECKPOINT_PASSIVE || xBusy==0 );

  if( pWal->readOnly ) return SQLITE_READONLY;
  WALTRACE(("WAL%p: checkpoint begins\n", pWal));

  /* IMPLEMENTATION-OF: R-62028-47212 All calls obtain an exclusive 
  ** "checkpoint" lock on the database file. */
  rc = walLockExclusive(pWal, WAL_CKPT_LOCK, 1);
  if( rc ){
    /* EVIDENCE-OF: R-10421-19736 If any other process is running a
    ** checkpoint operation at the same time, the lock cannot be obtained and
    ** SQLITE_BUSY is returned.
    ** EVIDENCE-OF: R-53820-33897 Even if there is a busy-handler configured,
    ** it will not be invoked in this case.
    */
    testcase( rc==SQLITE_BUSY );
    testcase( xBusy!=0 );
    return rc;
  }
  pWal->ckptLock = 1;

  /* IMPLEMENTATION-OF: R-59782-36818 The SQLITE_CHECKPOINT_FULL, RESTART and
  ** TRUNCATE modes also obtain the exclusive "writer" lock on the database
  ** file.
  **
  ** EVIDENCE-OF: R-60642-04082 If the writer lock cannot be obtained
  ** immediately, and a busy-handler is configured, it is invoked and the
  ** writer lock retried until either the busy-handler returns 0 or the
  ** lock is successfully obtained.
  */
  if( eMode!=SQLITE_CHECKPOINT_PASSIVE ){
    rc = walBusyLock(pWal, xBusy, pBusyArg, WAL_WRITE_LOCK, 1);
    if( rc==SQLITE_OK ){
      pWal->writeLock = 1;
    }else if( rc==SQLITE_BUSY ){
      eMode2 = SQLITE_CHECKPOINT_PASSIVE;
      xBusy2 = 0;
      rc = SQLITE_OK;
    }
  }

  /* Read the wal-index header. */
  if( rc==SQLITE_OK ){
    rc = walIndexReadHdr(pWal, &isChanged);
    if( isChanged && pWal->pDbFd->pMethods->iVersion>=3 ){
      sqlite3OsUnfetch(pWal->pDbFd, 0, 0);
    }
  }

  /* Copy data from the log to the database file. */
  if( rc==SQLITE_OK ){

    if( pWal->hdr.mxFrame && walPagesize(pWal)!=nBuf ){
      rc = SQLITE_CORRUPT_BKPT;
    }else{
      rc = walCheckpoint(pWal, db, eMode2, xBusy2, pBusyArg, sync_flags, zBuf);
    }

    /* If no error occurred, set the output variables. */
    if( rc==SQLITE_OK || rc==SQLITE_BUSY ){
      if( pnLog ) *pnLog = (int)pWal->hdr.mxFrame;
      if( pnCkpt ) *pnCkpt = (int)(walCkptInfo(pWal)->nBackfill);
    }
  }

  if( isChanged ){
    /* If a new wal-index header was loaded before the checkpoint was 
    ** performed, then the pager-cache associated with pWal is now
    ** out of date. So zero the cached wal-index header to ensure that
    ** next time the pager opens a snapshot on this database it knows that
    ** the cache needs to be reset.
    */
    memset(&pWal->hdr, 0, sizeof(WalIndexHdr));
  }

  /* Release the locks. */
  sqlite3WalEndWriteTransaction(pWal);
  walUnlockExclusive(pWal, WAL_CKPT_LOCK, 1);
  pWal->ckptLock = 0;
  WALTRACE(("WAL%p: checkpoint %s\n", pWal, rc ? "failed" : "ok"));
  return (rc==SQLITE_OK && eMode!=eMode2 ? SQLITE_BUSY : rc);
}